

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

Value * __thiscall
Json::ValueIteratorBase::key(Value *__return_storage_ptr__,ValueIteratorBase *this)

{
  CZString czstring;
  CZString local_20;
  
  Value::CZString::CZString(&local_20,(CZString *)((this->current_)._M_node + 1));
  if (local_20.cstr_ == (char *)0x0) {
    *(ushort *)&__return_storage_ptr__->field_0x8 =
         (ushort)*(undefined4 *)&__return_storage_ptr__->field_0x8 & 0xfe00 | 2;
    __return_storage_ptr__->comments_ = (CommentInfo *)0x0;
    __return_storage_ptr__->start_ = 0;
    __return_storage_ptr__->limit_ = 0;
    (__return_storage_ptr__->value_).int_ = (ulong)local_20.index_;
  }
  else if ((ulong)local_20.index_ == 0) {
    *(ushort *)&__return_storage_ptr__->field_0x8 =
         (ushort)*(undefined4 *)&__return_storage_ptr__->field_0x8 & 0xfe00 | 4;
    __return_storage_ptr__->comments_ = (CommentInfo *)0x0;
    __return_storage_ptr__->start_ = 0;
    __return_storage_ptr__->limit_ = 0;
    (__return_storage_ptr__->value_).string_ = local_20.cstr_;
  }
  else {
    Value::Value(__return_storage_ptr__,local_20.cstr_);
  }
  Value::CZString::~CZString(&local_20);
  return __return_storage_ptr__;
}

Assistant:

Value ValueIteratorBase::key() const {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  const Value::CZString czstring = (*current_).first;
  if (czstring.c_str()) {
    if (czstring.isStaticString())
      return Value(StaticString(czstring.c_str()));
    return Value(czstring.c_str());
  }
  return Value(czstring.index());
#else
  if (isArray_)
    return Value(ValueInternalArray::indexOf(iterator_.array_));
  bool isStatic;
  const char* memberName = ValueInternalMap::key(iterator_.map_, isStatic);
  if (isStatic)
    return Value(StaticString(memberName));
  return Value(memberName);
#endif
}